

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QString,_QConfFile_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QConfFile_*>_> *this,QString *key)

{
  byte bVar1;
  Node<QString,_QConfFile_*> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QString>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QString,_QConfFile_*> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_QConfFile_*> *)
             (((BVar3.span)->entries->storage).data + (ulong)bVar1 * 0x20);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }